

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pauth_helper.c
# Opt level: O2

uint64_t pauth_addpac(CPUARMState_conflict *env,uint64_t ptr,uint64_t modifier,ARMPACKey *key,
                     _Bool data)

{
  ARMMMUIdx mmu_idx;
  ARMVAParameters AVar1;
  ulong fieldval;
  uint64_t uVar2;
  int64_t iVar3;
  ulong uVar4;
  ulong uVar5;
  int length;
  ulong uVar6;
  int iVar7;
  int start;
  byte bVar8;
  
  mmu_idx = arm_stage1_mmu_idx_aarch64(env);
  AVar1 = aa64_va_parameters_aarch64(env,ptr,mmu_idx,data);
  fieldval = sextract64(ptr,(uint)(((uint)AVar1 & 0x200) == 0) * 8 + 0x37,1);
  iVar7 = 0x40 - ((uint)AVar1 >> 6 & 8);
  bVar8 = AVar1._0_1_;
  start = 0x40 - ((uint)AVar1 & 0xff);
  length = iVar7 - start;
  uVar2 = deposit64(ptr,start,length,fieldval);
  uVar2 = pauth_computepac(uVar2,modifier,*key);
  iVar3 = sextract64(ptr,start,length);
  if (((uint)AVar1 & 0x200) == 0) {
    uVar5 = 0xffffffffffffffff >> (bVar8 & 0x3f);
    uVar6 = ~uVar5 & 0xff7ffffffffffffe;
  }
  else {
    uVar5 = ~((0xffffffffffffffffU >> (0x48 - bVar8 & 0x3f)) << ((byte)start & 0x3f));
    uVar6 = (0xffffffffffffffffU >> (0x49 - bVar8 & 0x3f)) << ((byte)start & 0x3f);
  }
  uVar4 = 0;
  if (iVar3 - 1U < 0xfffffffffffffffe) {
    uVar4 = 1L << ((char)iVar7 - 1U & 0x3f);
  }
  return fieldval & 0x80000000000000 | uVar5 & ptr | (uVar4 ^ uVar2) & uVar6;
}

Assistant:

static uint64_t pauth_addpac(CPUARMState *env, uint64_t ptr, uint64_t modifier,
                             ARMPACKey *key, bool data)
{
    ARMMMUIdx mmu_idx = arm_stage1_mmu_idx(env);
    ARMVAParameters param = aa64_va_parameters(env, ptr, mmu_idx, data);
    uint64_t pac, ext_ptr, ext, test;
    int bot_bit, top_bit;

    /* If tagged pointers are in use, use ptr<55>, otherwise ptr<63>.  */
    if (param.tbi) {
        ext = sextract64(ptr, 55, 1);
    } else {
        ext = sextract64(ptr, 63, 1);
    }

    /* Build a pointer with known good extension bits.  */
    top_bit = 64 - 8 * param.tbi;
    bot_bit = 64 - param.tsz;
    ext_ptr = deposit64(ptr, bot_bit, top_bit - bot_bit, ext);

    pac = pauth_computepac(ext_ptr, modifier, *key);

    /*
     * Check if the ptr has good extension bits and corrupt the
     * pointer authentication code if not.
     */
    test = sextract64(ptr, bot_bit, top_bit - bot_bit);
    if (test != 0 && test != -1) {
        pac ^= MAKE_64BIT_MASK(top_bit - 1, 1);
    }

    /*
     * Preserve the determination between upper and lower at bit 55,
     * and insert pointer authentication code.
     */
    if (param.tbi) {
        ptr &= ~MAKE_64BIT_MASK(bot_bit, 55 - bot_bit + 1);
        pac &= MAKE_64BIT_MASK(bot_bit, 54 - bot_bit + 1);
    } else {
        ptr &= MAKE_64BIT_MASK(0, bot_bit);
        pac &= ~(MAKE_64BIT_MASK(55, 1) | MAKE_64BIT_MASK(0, bot_bit));
    }
    ext &= MAKE_64BIT_MASK(55, 1);
    return pac | ext | ptr;
}